

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall
TPZSkylMatrix<std::complex<long_double>_>::Decompose_Cholesky
          (TPZSkylMatrix<std::complex<long_double>_> *this,
          list<long,_std::allocator<long>_> *singular)

{
  undefined8 *puVar1;
  char cVar2;
  complex<long_double> **ppcVar3;
  complex<long_double> *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  undefined4 extraout_var;
  ostream *poVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  complex<long_double> *pcVar12;
  long lVar13;
  long lVar14;
  TPZSkylMatrix<std::complex<long_double>_> *__z;
  long lVar15;
  ulong uVar16;
  complex<long_double> *pcVar17;
  long lVar18;
  longdouble in_ST0;
  longdouble lVar20;
  longdouble in_ST1;
  longdouble lVar21;
  longdouble lVar22;
  longdouble in_ST2;
  longdouble in_ST3;
  complex<long_double> __r;
  long local_110 [2];
  undefined2 local_100;
  longdouble local_fc;
  list<long,_std::allocator<long>_> *local_f0;
  longdouble local_e4;
  long local_d8;
  complex<long_double> *local_d0;
  undefined1 local_c8 [40];
  TPZSkylMatrix<std::complex<long_double>_> *local_a0;
  long local_98;
  long local_90;
  longdouble local_84;
  undefined1 local_78 [32];
  undefined8 local_58 [5];
  long lVar19;
  
  cVar2 = (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDecomposed;
  local_f0 = singular;
  if (cVar2 != '\0') {
    if (cVar2 == '\x03') {
      return 1;
    }
    TPZMatrix<std::complex<long_double>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<long double>>::Decompose_Cholesky(std::list<int64_t> &) [TVar = std::complex<long double>]"
               ,"Decompose_Cholesky <Matrix already Decomposed>");
  }
  std::__cxx11::list<long,_std::allocator<long>_>::clear(local_f0);
  local_c8._0_8_ = SUB108((longdouble)0,0);
  local_c8._8_2_ = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
  local_c8._16_8_ = local_c8._0_8_;
  local_c8._24_2_ = local_c8._8_2_;
  iVar7 = (*(this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable
            ._vptr_TPZSavable[0xc])(this);
  lVar13 = CONCAT44(extraout_var,iVar7);
  local_110[0] = 0;
  local_84 = (longdouble)1e-16;
  local_d8 = lVar13;
  local_a0 = this;
  while( true ) {
    if (lVar13 <= local_110[0]) {
      lVar13 = (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
      if (lVar13 != 0) {
        __z = this;
        (*(this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x24])(local_58,this,lVar13 + -1);
        __r._M_value._16_8_ = local_58[2];
        __r._M_value._24_2_ = SUB82(local_58[3],0);
        __r._M_value._26_4_ = SUB84((ulong)local_58[3] >> 0x10,0);
        __r._M_value._30_2_ = SUB82((ulong)local_58[3] >> 0x30,0);
        __r._M_value._0_8_ = local_58[0];
        __r._M_value._8_2_ = SUB82(local_58[1],0);
        __r._M_value._10_4_ = SUB84((ulong)local_58[1] >> 0x10,0);
        __r._M_value._14_2_ = SUB82((ulong)local_58[1] >> 0x30,0);
        std::abs<long_double>((longdouble *)&__r,(complex<long_double> *)__z);
        local_fc = ABS(in_ST0);
        __r._M_value._0_8_ = SUB108((longdouble)1e-15,0);
        __r._M_value._8_2_ = SUB102((unkuint10)(longdouble)1e-15 >> 0x40,0);
        __r._M_value._16_8_ = SUB108((longdouble)0,0);
        __r._M_value._24_2_ = SUB102((unkuint10)(longdouble)0 >> 0x40,0);
        std::abs<long_double>((longdouble *)&__r,(complex<long_double> *)__z);
        if (local_fc < ABS(in_ST1)) {
          __r._M_value._0_8_ =
               (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow + -1;
          std::__cxx11::list<long,_std::allocator<long>_>::push_back
                    (local_f0,(value_type_conflict5 *)&__r);
          lVar13 = (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow + -1
          ;
          __r._M_value._0_8_ = SUB108((longdouble)1,0);
          __r._M_value._8_2_ = SUB102((unkuint10)(longdouble)1 >> 0x40,0);
          __r._M_value._16_8_ = SUB108((longdouble)0,0);
          __r._M_value._24_2_ = SUB102((unkuint10)(longdouble)0 >> 0x40,0);
          (*(this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable
            ._vptr_TPZSavable[0x23])(this,lVar13,lVar13,&__r);
        }
      }
      (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDecomposed = '\x03';
      (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDefPositive = '\x01';
      return 1;
    }
    ppcVar3 = (this->fElem).fStore;
    pcVar4 = ppcVar3[local_110[0]];
    local_d0 = ppcVar3[local_110[0] + 1];
    if (local_d0 == pcVar4) break;
    lVar21 = (longdouble)0;
    lVar22 = lVar21;
    lVar20 = in_ST0;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    while (pcVar17 = pcVar4 + 1, pcVar17 < local_d0) {
      __r._M_value._0_8_ = SUB108(*(unkbyte10 *)pcVar17->_M_value,0);
      __r._M_value._8_2_ = SUB102((unkuint10)*(unkbyte10 *)pcVar17->_M_value >> 0x40,0);
      __r._M_value._16_8_ = SUB108(-*(longdouble *)(pcVar4[1]._M_value + 0x10),0);
      __r._M_value._24_2_ = SUB102((unkuint10)-*(longdouble *)(pcVar4[1]._M_value + 0x10) >> 0x40,0)
      ;
      local_fc = lVar21;
      local_e4 = lVar22;
      std::complex<long_double>::operator*=(&__r,pcVar17);
      lVar21 = local_fc + (longdouble)CONCAT28(__r._M_value._8_2_,__r._M_value._0_8_);
      lVar22 = local_e4 + (longdouble)CONCAT28(__r._M_value._24_2_,__r._M_value._16_8_);
      pcVar4 = pcVar17;
    }
    pcVar4 = (this->fElem).fStore[local_110[0]];
    lVar21 = *(longdouble *)pcVar4->_M_value - lVar21;
    lVar22 = *(longdouble *)(pcVar4->_M_value + 0x10) - lVar22;
    local_c8._0_8_ = SUB108(lVar21,0);
    local_c8._8_2_ = (undefined2)((unkuint10)lVar21 >> 0x40);
    local_c8._10_4_ = *(undefined4 *)(pcVar4->_M_value + 10);
    local_c8._14_2_ = *(undefined2 *)(pcVar4->_M_value + 0xe);
    local_c8._16_8_ = SUB108(lVar22,0);
    local_c8._24_2_ = (undefined2)((unkuint10)lVar22 >> 0x40);
    local_c8._26_4_ = *(undefined4 *)(pcVar4->_M_value + 0x1a);
    local_c8._30_2_ = *(undefined2 *)(pcVar4->_M_value + 0x1e);
    in_ST3 = in_ST2;
    std::abs<long_double>((longdouble *)local_c8,(complex<long_double> *)(local_c8 + 10));
    if (lVar20 < local_84) {
      std::__cxx11::list<long,_std::allocator<long>_>::push_back(local_f0,local_110);
      poVar8 = std::operator<<((ostream *)&std::cout,"Decompose_Cholesky");
      poVar8 = std::operator<<(poVar8," Singular equation pivot ");
      poVar8 = std::operator<<(poVar8,(complex *)local_c8);
      poVar8 = std::operator<<(poVar8," k ");
      poVar8 = std::ostream::_M_insert<long>((long)poVar8);
      std::endl<char,std::char_traits<char>>(poVar8);
      local_c8._0_8_ = SUB108((longdouble)1,0);
      local_c8._8_2_ = (undefined2)((unkuint10)(longdouble)1 >> 0x40);
      local_c8._16_8_ = SUB108((longdouble)0,0);
      local_c8._24_2_ = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
    }
    std::sqrt<long_double>(&__r,(complex<long_double> *)local_c8);
    pcVar4 = (this->fElem).fStore[local_110[0]];
    *(undefined8 *)(pcVar4->_M_value + 0x10) = __r._M_value._16_8_;
    *(ulong *)(pcVar4->_M_value + 0x18) =
         CONCAT26(__r._M_value._30_2_,CONCAT42(__r._M_value._26_4_,__r._M_value._24_2_));
    *(undefined8 *)pcVar4->_M_value = __r._M_value._0_8_;
    *(ulong *)(pcVar4->_M_value + 8) =
         CONCAT26(__r._M_value._14_2_,CONCAT42(__r._M_value._10_4_,__r._M_value._8_2_));
    local_c8._0_8_ = __r._M_value._0_8_;
    local_c8._8_2_ = __r._M_value._8_2_;
    local_c8._10_4_ = __r._M_value._10_4_;
    local_c8._14_2_ = __r._M_value._14_2_;
    local_c8._16_8_ = __r._M_value._16_8_;
    local_c8._24_2_ = __r._M_value._24_2_;
    local_c8._26_4_ = __r._M_value._26_4_;
    local_c8._30_2_ = __r._M_value._30_2_;
    lVar14 = 0x40;
    lVar15 = -0x40;
    lVar11 = 2;
    lVar19 = local_110[0];
    while( true ) {
      lVar18 = lVar19 + 1;
      if (lVar13 <= lVar18) break;
      ppcVar3 = (this->fElem).fStore;
      pcVar4 = ppcVar3[lVar18];
      lVar10 = (long)ppcVar3[lVar19 + 2] - (long)pcVar4 >> 5;
      if (lVar11 < lVar10) {
        pcVar17 = ppcVar3[local_110[0]];
        pcVar12 = pcVar17 + 1;
        uVar16 = (ulong)((long)local_d0 - (long)pcVar12) >> 5;
        uVar9 = (ulong)((long)ppcVar3[lVar19 + 2] + (lVar15 - (long)pcVar4)) >> 5;
        if ((uint)uVar9 < (uint)uVar16) {
          uVar16 = uVar9;
        }
        uVar16 = uVar16 & 0xffffffff;
        lVar13 = 0;
        lVar21 = (longdouble)0;
        lVar22 = lVar21;
        local_98 = lVar15;
        local_90 = lVar14;
        while (this = local_a0, iVar7 = (int)uVar16, uVar16 = (ulong)(iVar7 - 1), iVar7 != 0) {
          puVar1 = (undefined8 *)(pcVar4->_M_value + lVar13 + lVar14);
          local_78._0_10_ = *(unkbyte10 *)(pcVar12->_M_value + lVar13);
          local_78._16_10_ = -*(longdouble *)(pcVar17[1]._M_value + lVar13 + 0x10);
          __r._M_value._0_8_ = *puVar1;
          uVar5 = puVar1[1];
          __r._M_value._16_8_ = puVar1[2];
          uVar6 = puVar1[3];
          __r._M_value._8_2_ = SUB82(uVar5,0);
          __r._M_value._10_4_ = SUB84((ulong)uVar5 >> 0x10,0);
          __r._M_value._14_2_ = SUB82((ulong)uVar5 >> 0x30,0);
          __r._M_value._24_2_ = SUB82(uVar6,0);
          __r._M_value._26_4_ = SUB84((ulong)uVar6 >> 0x10,0);
          __r._M_value._30_2_ = SUB82((ulong)uVar6 >> 0x30,0);
          local_fc = lVar21;
          local_e4 = lVar22;
          std::complex<long_double>::operator*=(&__r,(complex<long_double> *)local_78);
          lVar21 = local_fc + (longdouble)CONCAT28(__r._M_value._8_2_,__r._M_value._0_8_);
          lVar22 = local_e4 + (longdouble)CONCAT28(__r._M_value._24_2_,__r._M_value._16_8_);
          lVar13 = lVar13 + 0x20;
        }
        pcVar4 = (local_a0->fElem).fStore[lVar18];
        __r._M_value._14_2_ = *(undefined2 *)(pcVar4[lVar11 + -1]._M_value + 0xe);
        local_78._4_2_ = __r._M_value._14_2_;
        __r._M_value._10_4_ = *(undefined4 *)(pcVar4[lVar11 + -1]._M_value + 10);
        local_78._0_4_ = __r._M_value._10_4_;
        __r._M_value._30_2_ = *(undefined2 *)(pcVar4[lVar11 + -1]._M_value + 0x1e);
        __r._M_value._26_4_ = *(undefined4 *)(pcVar4[lVar11 + -1]._M_value + 0x1a);
        lVar21 = *(longdouble *)pcVar4[lVar11 + -1]._M_value - lVar21;
        lVar22 = *(longdouble *)(pcVar4[lVar11 + -1]._M_value + 0x10) - lVar22;
        __r._M_value._0_8_ = SUB108(lVar21,0);
        __r._M_value._8_2_ = SUB102((unkuint10)lVar21 >> 0x40,0);
        __r._M_value._16_8_ = SUB108(lVar22,0);
        __r._M_value._24_2_ = SUB102((unkuint10)lVar22 >> 0x40,0);
        local_110[1]._4_4_ = __r._M_value._26_4_;
        local_100 = __r._M_value._30_2_;
        std::complex<long_double>::operator/=(&__r,(complex<long_double> *)local_c8);
        pcVar4 = (this->fElem).fStore[lVar18];
        puVar1 = (undefined8 *)(pcVar4[lVar11 + -1]._M_value + 0x10);
        *puVar1 = __r._M_value._16_8_;
        puVar1[1] = CONCAT26(__r._M_value._30_2_,CONCAT42(__r._M_value._26_4_,__r._M_value._24_2_));
        pcVar4 = pcVar4 + lVar11 + -1;
        *(undefined8 *)pcVar4->_M_value = __r._M_value._0_8_;
        *(ulong *)(pcVar4->_M_value + 8) =
             CONCAT26(__r._M_value._14_2_,CONCAT42(__r._M_value._10_4_,__r._M_value._8_2_));
        lVar13 = local_d8;
        lVar14 = local_90;
        lVar15 = local_98;
      }
      else if (lVar10 == lVar11) {
        std::complex<long_double>::operator/=(pcVar4 + lVar11 + -1,(complex<long_double> *)local_c8)
        ;
        lVar13 = local_d8;
      }
      lVar11 = lVar11 + 1;
      lVar15 = lVar15 + -0x20;
      lVar14 = lVar14 + 0x20;
      lVar19 = lVar18;
    }
    local_110[0] = local_110[0] + 1;
  }
  return 0;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular)
{
	if(this->fDecomposed == ECholesky) return 1;
	if (  this->fDecomposed )  TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_Cholesky <Matrix already Decomposed>" );
    
#ifdef DUMP_BEFORE_DECOMPOSE
	dump_matrix(this, "TPZSkylMatrix::Decompose_Cholesky(singular)");
#endif
    
	singular.clear();
	TVar pivot;
	RTVar Tol;
	ZeroTolerance(Tol);
	int64_t dimension = this->Dim();
	/*  if(Dim() > 100) {
	 cout << "\nTPZSkylMatrix Cholesky decomposition Dim = " << Dim() << endl;
	 cout.flush();
	 }*/
	for ( int64_t k = 0; k < dimension; k++ )
	{
		/*    if(!(k%100) && Dim() > 100) {
		 cout <<  k << ' ';
		 cout.flush();
		 }
		 if(!(k%1000)) cout << endl;*/
		if ( Size(k) == 0 )	return( 0 );
		
		// Faz sum = SOMA( A(k,p) * A(k,p) ), p = 1, ..., k-1.
		//
		TVar sum = 0.0;
		TVar *elem_k = fElem[k]+1;
		TVar *end_k  = fElem[k]+Size(k);
        if constexpr (is_complex<TVar>::value){
            for ( ; elem_k < end_k; elem_k++ ) sum += std::conj(*elem_k) * (*elem_k);
        }else{
#pragma clang loop vectorize_width(2)
            for ( ; elem_k < end_k; elem_k++ ) sum += (*elem_k) * (*elem_k);
        }

		
		// Faz A(k,k) = sqrt( A(k,k) - sum ).
		//
		pivot = fElem[k][0] - sum;
        //		if ( pivot < ((TVar)1.e-9) ) {
		if(abs(pivot) < Tol) {
			singular.push_back(k);
            std::cout << __FUNCTION__ << " Singular equation pivot " << pivot << " k " << k << std::endl;
			pivot = 1.;
		}
		// A matriz nao e' definida positiva.
		
		pivot = fElem[k][0] = sqrt( pivot );
		
		// Loop para i = k+1 ... Dim().
		//
		int64_t i=k+1;
		for ( int64_t j = 2; i<dimension; j++,i++ ) {
			// Se tiverem elementos na linha 'i' cuja coluna e'
			//  menor do que 'K'...
			if ( Size(i) > j ) {
				// Faz sum = SOMA( A(i,p) * A(k,p) ), p = 1,..,k-1.
				sum = 0.0;
				TVar *elem_i = &fElem[i][j];
				TVar *end_i  = fElem[i+1];
				elem_k = &(fElem[k][1]);
				// Vectorizable loop
				unsigned max_l = end_i - elem_i;
				unsigned tmp = end_k - elem_k;
				if (tmp < max_l) max_l = tmp;
                if constexpr (is_complex<TVar>::value){
                    for(unsigned l=0; l<max_l; l++) 
                        sum += (*elem_i++) * std::conj(*elem_k++);
                }else{
#pragma clang loop vectorize_width(2)
                    for(unsigned l=0; l<max_l; l++) 
                        sum += (*elem_i++) * (*elem_k++);
                }

				// Faz A(i,k) = (A(i,k) - sum) / A(k,k)
				fElem[i][j-1] = (fElem[i][j-1] -sum) / pivot;
			} else if ( Size(i) == j ) fElem[i][j-1] /= pivot;
			
			// Se nao tiverem estes elementos, sum = 0.0.
			
			// Se nao existir nem o elemento A(i,k), nao faz nada.
		}
	}
	
	if(this->Rows() && fabs(GetVal(this->Rows()-1,this->Rows()-1)) < fabs((TVar)1.e-15))
	{
		singular.push_back(this->Rows()-1);
		PutVal(this->Rows()-1,this->Rows()-1,1.);
	}
	this->fDecomposed  = ECholesky;
	this->fDefPositive = 1;
	return( 1 );
}